

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_pointee_type_id(Compiler *this,uint32_t type_id)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  SPIRType *p_type;
  uint32_t type_id_local;
  Compiler *this_local;
  
  pSVar2 = get<diligent_spirv_cross::SPIRType>(this,type_id);
  p_type._4_4_ = type_id;
  if ((pSVar2->pointer & 1U) != 0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->parent_type);
    if (uVar1 == 0) {
      __assert_fail("p_type->parent_type",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                    ,0x515,
                    "uint32_t diligent_spirv_cross::Compiler::get_pointee_type_id(uint32_t) const");
    }
    p_type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->parent_type);
  }
  return p_type._4_4_;
}

Assistant:

uint32_t Compiler::get_pointee_type_id(uint32_t type_id) const
{
	auto *p_type = &get<SPIRType>(type_id);
	if (p_type->pointer)
	{
		assert(p_type->parent_type);
		type_id = p_type->parent_type;
	}
	return type_id;
}